

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_queue_impl_qwqr.cpp
# Opt level: O1

bool __thiscall
foxxll::file_offset_match::operator()(file_offset_match *this,request_ptr *a,request_ptr *b)

{
  request *prVar1;
  request *prVar2;
  bool bVar3;
  
  prVar1 = a->ptr_;
  if ((prVar1 != (request *)0x0) && (prVar2 = b->ptr_, prVar2 != (request *)0x0)) {
    if (prVar1->offset_ == prVar2->offset_) {
      bVar3 = prVar1->file_ == prVar2->file_;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("ptr_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/extlib/tlx/tlx/counting_ptr.hpp"
                ,0xc5,
                "Type *tlx::CountingPtr<foxxll::request>::operator->() const [Type = foxxll::request, Deleter = tlx::CountingPtrDefaultDeleter]"
               );
}

Assistant:

bool operator () (
        const request_ptr& a,
        const request_ptr& b) const
    {
        // matching file and offset are enough to cause problems
        return (a->offset() == b->offset()) &&
               (a->get_file() == b->get_file());
    }